

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

quad_value_bit_vector * bsim::unknown_bv(quad_value_bit_vector *__return_storage_ptr__,int len)

{
  int iVar1;
  string str;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  iVar1 = 0;
  if (0 < len) {
    iVar1 = len;
  }
  while (iVar1 != 0) {
    std::__cxx11::string::append((char *)&local_48);
    iVar1 = iVar1 + -1;
  }
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,len,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline quad_value_bit_vector unknown_bv(const int len) {
    std::string str = "";
    for (int i = 0; i < len; i++) {
      str += "x";
    }
    return quad_value_bit_vector(len, str);
  }